

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockContextBuildAddWindowsToNodes(ImGuiContext *ctx,ImGuiID root_id)

{
  ImGuiWindow *window;
  ImGuiWindow **ppIVar1;
  ImGuiDockNode *node;
  ImGuiDockNode *pIVar2;
  int i;
  
  i = 0;
  do {
    if ((ctx->Windows).Size <= i) {
      return;
    }
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[](&ctx->Windows,i);
    window = *ppIVar1;
    if (((window->DockId != 0) && (ctx->FrameCount + -1 <= window->LastFrameActive)) &&
       (window->DockNode == (ImGuiDockNode *)0x0)) {
      node = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,window->DockId);
      if (node == (ImGuiDockNode *)0x0) {
        __assert_fail("node != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                      ,0x36e8,
                      "void ImGui::DockContextBuildAddWindowsToNodes(ImGuiContext *, ImGuiID)");
      }
      if (root_id != 0) {
        pIVar2 = DockNodeGetRootNode(node);
        if (pIVar2->ID != root_id) goto LAB_00158c01;
      }
      DockNodeAddWindow(node,window,true);
    }
LAB_00158c01:
    i = i + 1;
  } while( true );
}

Assistant:

void ImGui::DockContextBuildAddWindowsToNodes(ImGuiContext* ctx, ImGuiID root_id)
{
    // Rebind all windows to nodes (they can also lazily rebind but we'll have a visible glitch during the first frame)
    ImGuiContext& g = *ctx;
    for (int n = 0; n < g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (window->DockId == 0 || window->LastFrameActive < g.FrameCount - 1)
            continue;
        if (window->DockNode != NULL)
            continue;

        ImGuiDockNode* node = DockContextFindNodeByID(ctx, window->DockId);
        IM_ASSERT(node != NULL);   // This should have been called after DockContextBuildNodesFromSettings()
        if (root_id == 0 || DockNodeGetRootNode(node)->ID == root_id)
            DockNodeAddWindow(node, window, true);
    }
}